

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1-cxx.cpp
# Opt level: O0

void __thiscall Secp256K1::~Secp256K1(Secp256K1 *this)

{
  Secp256K1 *this_local;
  
  secp256k1_context_destroy(this->ctx);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->privKey);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->pubKey);
  return;
}

Assistant:

Secp256K1::~Secp256K1()
{
    secp256k1_context_destroy(ctx);
}